

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O1

int tinyfd_messageBox(char *aTitle,char *aMessage,char *aDialogType,char *aIconType,
                     int aDefaultButton)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  FILE *__stream;
  char *pcVar4;
  undefined8 uVar5;
  size_t __n;
  long lVar6;
  uint uVar7;
  char *__src;
  bool bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  termios infoOri;
  termios info;
  char lBuff [1024];
  termios local_4b0;
  termios local_474;
  char local_438 [4];
  undefined1 uStack_434;
  
  local_438[0] = '\0';
  if (aTitle == (char *)0x0) {
    lVar6 = 0x400;
  }
  else {
    sVar3 = strlen(aTitle);
    lVar6 = sVar3 + 0x400;
  }
  if (aMessage == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(aMessage);
  }
  if ((aTitle == (char *)0x0) || (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 != 0)) {
    __dest = (char *)malloc(sVar3 + lVar6);
  }
  else {
    __dest = (char *)0x0;
  }
  iVar2 = osascriptPresent();
  if (iVar2 == 0) {
    iVar2 = kdialogPresent();
    if (iVar2 != 0) {
      if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
        uVar5 = 0x676f6c6169646b;
        goto LAB_00111124;
      }
      builtin_strncpy(__dest,"kdialog",8);
      iVar2 = kdialogPresent();
      if (iVar2 == 2) {
        sVar3 = strlen(__dest);
        memcpy(__dest + sVar3," --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)",
               0x41);
      }
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3," --",4);
      if ((aDialogType == (char *)0x0) ||
         (((iVar2 = strcmp("okcancel",aDialogType), iVar2 != 0 &&
           (iVar2 = strcmp("yesno",aDialogType), iVar2 != 0)) &&
          (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)))) {
        if (aIconType == (char *)0x0) {
LAB_00110db8:
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"msgbox",7);
        }
        else {
          iVar2 = strcmp("error",aIconType);
          if (iVar2 == 0) {
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"error",6);
          }
          else {
            iVar2 = strcmp("warning",aIconType);
            if (iVar2 != 0) goto LAB_00110db8;
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"sorry",6);
          }
        }
      }
      else {
        if ((aIconType != (char *)0x0) &&
           ((iVar2 = strcmp("warning",aIconType), iVar2 == 0 ||
            (iVar2 = strcmp("error",aIconType), iVar2 == 0)))) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"warning",8);
        }
        iVar2 = strcmp("yesnocancel",aDialogType);
        sVar3 = strlen(__dest);
        if (iVar2 == 0) {
          builtin_strncpy(__dest + sVar3,"yesnocancel",0xc);
        }
        else {
          builtin_strncpy(__dest + sVar3,"yesno",6);
        }
      }
      sVar3 = strlen(__dest);
      (__dest + sVar3)[0] = ' ';
      (__dest + sVar3)[1] = '\"';
      __dest[sVar3 + 2] = '\0';
      if (aMessage != (char *)0x0) {
        strcat(__dest,aMessage);
      }
      sVar3 = strlen(__dest);
      (__dest + sVar3)[0] = '\"';
      (__dest + sVar3)[1] = '\0';
      if ((aDialogType != (char *)0x0) && (iVar2 = strcmp("okcancel",aDialogType), iVar2 == 0)) {
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3," --yes-label Ok --no-label Cancel",0x22);
      }
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3," --title \"",0xb);
        strcat(__dest,aTitle);
        sVar3 = strlen(__dest);
        (__dest + sVar3)[0] = '\"';
        (__dest + sVar3)[1] = '\0';
      }
      iVar2 = strcmp("yesnocancel",aDialogType);
      sVar3 = strlen(__dest);
      pcVar4 = __dest + sVar3;
      if (iVar2 != 0) {
        builtin_strncpy(__dest + sVar3 + 0x10,"hen echo 1;else echo 0;fi",0x1a);
        uVar10._0_1_ = ';';
        uVar10._1_1_ = 'i';
        uVar10._2_1_ = 'f';
        uVar10._3_1_ = ' ';
        uVar14._0_1_ = '[';
        uVar14._1_1_ = ' ';
        uVar14._2_1_ = '$';
        uVar14._3_1_ = '?';
        uVar19._0_1_ = ' ';
        uVar19._1_1_ = '=';
        uVar19._2_1_ = ' ';
        uVar19._3_1_ = '0';
        uVar23._0_1_ = ' ';
        uVar23._1_1_ = ']';
        uVar23._2_1_ = ';';
        uVar23._3_1_ = 't';
        goto LAB_001117b0;
      }
      __src = "; x=$? ;if [ $x = 0 ] ;then echo 1;elif [ $x = 1 ] ;then echo 2;else echo 0;fi";
      sVar3 = 0x4f;
      goto LAB_001117c4;
    }
    iVar2 = zenityPresent();
    if ((iVar2 == 0) && (iVar2 = matedialogPresent(), iVar2 == 0)) {
      if (shellementaryPresent_lShellementaryPresent == '\0') {
        shellementaryPresent_lShellementaryPresent = '\x01';
      }
      if (((shellementaryPresent_lShellementaryPresent == '\0') &&
          (iVar2 = graphicMode(), iVar2 != 0)) || (iVar2 = qarmaPresent(), iVar2 != 0))
      goto LAB_00110e35;
      iVar2 = gxmessagePresent();
      if (((iVar2 == 0) && (iVar2 = gmessagePresent(), iVar2 == 0)) &&
         ((iVar2 = gdialogPresent(), iVar2 == 0 &&
          ((iVar2 = xdialogPresent(), iVar2 == 0 && (iVar2 = tkinter2Present(), iVar2 != 0)))))) {
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          uVar16._0_1_ = 'o';
          uVar16._1_1_ = 'n';
          uVar16._2_1_ = '2';
          uVar16._3_1_ = '-';
LAB_00112482:
          tinyfd_response._4_2_ = (undefined2)uVar16;
          tinyfd_response[6] = SUB41(uVar16,2);
          tinyfd_response[7] = SUB41(uVar16,3);
          builtin_strncpy(tinyfd_response,"pyth",4);
          builtin_strncpy(tinyfd_response + 8,"tkinter",8);
          return 1;
        }
        strcpy(__dest,gPython2Name);
        iVar2 = isTerminalRunning();
        if ((iVar2 == 0) && (iVar2 = isDarwin(), iVar2 != 0)) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3," -i",4);
        }
        sVar3 = strlen(__dest);
        memcpy(__dest + sVar3,
               " -S -c \"import Tkinter,tkMessageBox;root=Tkinter.Tk();root.withdraw();",0x47);
        iVar2 = isDarwin();
        if (iVar2 != 0) {
          sVar3 = strlen(__dest);
          memcpy(__dest + sVar3,
                 "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                 ,0x78);
        }
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"res=tkMessageBox.",0x12);
        if (aDialogType == (char *)0x0) {
LAB_00112035:
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"showinfo(",10);
        }
        else {
          iVar2 = strcmp("okcancel",aDialogType);
          if (iVar2 == 0) {
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"askokcancel(",0xd);
            sVar3 = strlen(__dest);
            pcVar4 = __dest + sVar3;
            if (aDefaultButton == 0) {
              builtin_strncpy(__dest + sVar3 + 0xd,"sageBox.CANCEL,",0x10);
            }
            else {
              builtin_strncpy(__dest + sVar3 + 9,"kMessageBox.OK,",0x10);
            }
          }
          else {
            iVar2 = strcmp("yesno",aDialogType);
            if (iVar2 != 0) {
              iVar2 = strcmp("yesnocancel",aDialogType);
              if (iVar2 != 0) goto LAB_00112035;
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3,"askyesnocancel(",0x10);
              if (aDefaultButton == 0) {
                sVar3 = strlen(__dest);
                builtin_strncpy(__dest + sVar3,"default=tkMessageBox.CANCEL,",0x1d);
              }
              else if (aDefaultButton == 2) {
                sVar3 = strlen(__dest);
                builtin_strncpy(__dest + sVar3,"default=tkMessageBox.NO,",0x19);
              }
              else if (aDefaultButton == 1) {
                sVar3 = strlen(__dest);
                builtin_strncpy(__dest + sVar3,"default=tkMessageBox.YES,",0x1a);
              }
              goto LAB_00112e1f;
            }
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"askyesno(",10);
            sVar3 = strlen(__dest);
            pcVar4 = __dest + sVar3;
            if (aDefaultButton == 0) {
              builtin_strncpy(__dest + sVar3 + 9,"kMessageBox.NO,",0x10);
            }
            else {
              builtin_strncpy(__dest + sVar3 + 10,"MessageBox.YES,",0x10);
            }
          }
          builtin_strncpy(pcVar4,"default=tkMessag",0x10);
        }
LAB_00112e1f:
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"icon=\'",7);
        if ((aIconType == (char *)0x0) ||
           (((iVar2 = strcmp("question",aIconType), iVar2 != 0 &&
             (iVar2 = strcmp("error",aIconType), iVar2 != 0)) &&
            (iVar2 = strcmp("warning",aIconType), iVar2 != 0)))) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"info",5);
        }
        else {
          strcat(__dest,aIconType);
        }
        sVar3 = strlen(__dest);
        (__dest + sVar3)[0] = '\'';
        (__dest + sVar3)[1] = ',';
        __dest[sVar3 + 2] = '\0';
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"title=\'",8);
          strcat(__dest,aTitle);
          sVar3 = strlen(__dest);
          (__dest + sVar3)[0] = '\'';
          (__dest + sVar3)[1] = ',';
          __dest[sVar3 + 2] = '\0';
        }
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"message=\'",10);
          sVar3 = strlen(__dest);
          replaceSubStr(aMessage,"\n","\\n",__dest + sVar3);
          sVar3 = strlen(__dest);
          (__dest + sVar3)[0] = '\'';
          (__dest + sVar3)[1] = '\0';
        }
        if ((aDialogType != (char *)0x0) && (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 == 0))
        {
          sVar3 = strlen(__dest);
          pcVar4 = __dest + sVar3;
          __src = 
          ");\nif res is None :\n\tprint 0\nelif res is False :\n\tprint 2\nelse :\n\tprint 1\n\"";
          sVar3 = 0x4c;
          goto LAB_001117c4;
        }
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,");\nif res is False :\n\tprint 0\nel",0x20);
        uVar11._0_1_ = 's';
        uVar11._1_1_ = 'e';
        uVar11._2_1_ = ' ';
        uVar11._3_1_ = ':';
        uVar15._0_1_ = '\n';
        uVar15._1_1_ = '\t';
        uVar15._2_1_ = 'p';
        uVar15._3_1_ = 'r';
        uVar20._0_1_ = 'i';
        uVar20._1_1_ = 'n';
        uVar20._2_1_ = 't';
        uVar20._3_1_ = ' ';
        uVar24._0_1_ = '1';
        uVar24._1_1_ = '\n';
        uVar24._2_1_ = '\"';
        uVar24._3_1_ = '\0';
LAB_00112331:
        pcVar4 = __dest + sVar3 + 0x20;
        *(undefined4 *)pcVar4 = uVar11;
        *(undefined4 *)(pcVar4 + 4) = uVar15;
        *(undefined4 *)(pcVar4 + 8) = uVar20;
        *(undefined4 *)(pcVar4 + 0xc) = uVar24;
        goto LAB_001117c9;
      }
      iVar2 = gxmessagePresent();
      if ((((iVar2 == 0) && (iVar2 = gmessagePresent(), iVar2 == 0)) &&
          (iVar2 = gdialogPresent(), iVar2 == 0)) &&
         ((iVar2 = xdialogPresent(), iVar2 == 0 && (iVar2 = tkinter3Present(), iVar2 != 0)))) {
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          uVar16._0_1_ = 'o';
          uVar16._1_1_ = 'n';
          uVar16._2_1_ = '3';
          uVar16._3_1_ = '-';
          goto LAB_00112482;
        }
        strcpy(__dest,gPython3Name);
        sVar3 = strlen(__dest);
        memcpy(__dest + sVar3,
               " -S -c \"import tkinter;from tkinter import messagebox;root=tkinter.Tk();root.withdraw();"
               ,0x59);
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"res=messagebox.",0x10);
        if (aDialogType == (char *)0x0) {
LAB_00112109:
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"showinfo(",10);
        }
        else {
          iVar2 = strcmp("okcancel",aDialogType);
          if (iVar2 == 0) {
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"askokcancel(",0xd);
            sVar3 = strlen(__dest);
            pcVar4 = __dest + sVar3;
            if (aDefaultButton == 0) {
              builtin_strncpy(__dest + sVar3,"default=messagebox.CANCEL,",0x1b);
            }
            else {
              builtin_strncpy(__dest + sVar3,"default=messageb",0x10);
              uVar5 = 0x2c4b4f2e786f62;
LAB_00112fb4:
              *(undefined8 *)(pcVar4 + 0xf) = uVar5;
            }
          }
          else {
            iVar2 = strcmp("yesno",aDialogType);
            if (iVar2 == 0) {
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3,"askyesno(",10);
              sVar3 = strlen(__dest);
              pcVar4 = __dest + sVar3;
              if (aDefaultButton == 0) {
                builtin_strncpy(__dest + sVar3,"default=messageb",0x10);
                uVar5 = 0x2c4f4e2e786f62;
                goto LAB_00112fb4;
              }
              builtin_strncpy(__dest + sVar3,"default=messagebox.YES,",0x18);
            }
            else {
              iVar2 = strcmp("yesnocancel",aDialogType);
              if (iVar2 != 0) goto LAB_00112109;
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3,"askyesnocancel(",0x10);
              if (aDefaultButton == 0) {
                sVar3 = strlen(__dest);
                builtin_strncpy(__dest + sVar3,"default=messagebox.CANCEL,",0x1b);
              }
              else {
                if (aDefaultButton == 2) {
                  sVar3 = strlen(__dest);
                  builtin_strncpy(__dest + sVar3 + 0xf,"box.NO,",8);
                }
                else {
                  if (aDefaultButton != 1) goto LAB_00112fb8;
                  sVar3 = strlen(__dest);
                  builtin_strncpy(__dest + sVar3 + 0x10,"ox.YES,",8);
                }
                builtin_strncpy(__dest + sVar3,"default=messageb",0x10);
              }
            }
          }
        }
LAB_00112fb8:
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"icon=\'",7);
        if ((aIconType == (char *)0x0) ||
           (((iVar2 = strcmp("question",aIconType), iVar2 != 0 &&
             (iVar2 = strcmp("error",aIconType), iVar2 != 0)) &&
            (iVar2 = strcmp("warning",aIconType), iVar2 != 0)))) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"info",5);
        }
        else {
          strcat(__dest,aIconType);
        }
        sVar3 = strlen(__dest);
        (__dest + sVar3)[0] = '\'';
        (__dest + sVar3)[1] = ',';
        __dest[sVar3 + 2] = '\0';
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"title=\'",8);
          strcat(__dest,aTitle);
          sVar3 = strlen(__dest);
          (__dest + sVar3)[0] = '\'';
          (__dest + sVar3)[1] = ',';
          __dest[sVar3 + 2] = '\0';
        }
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"message=\'",10);
          sVar3 = strlen(__dest);
          replaceSubStr(aMessage,"\n","\\n",__dest + sVar3);
          sVar3 = strlen(__dest);
          (__dest + sVar3)[0] = '\'';
          (__dest + sVar3)[1] = '\0';
        }
        if ((aDialogType != (char *)0x0) && (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 == 0))
        {
          sVar3 = strlen(__dest);
          pcVar4 = __dest + sVar3;
          __src = 
          ");\nif res is None :\n\tprint(0)\nelif res is False :\n\tprint(2)\nelse :\n\tprint 1\n\""
          ;
          sVar3 = 0x4e;
          goto LAB_001117c4;
        }
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,");\nif res is False :\n\tprint(0)\nelse :\n\tprint(1)\n\"",
                        0x32);
        goto LAB_001117c9;
      }
      iVar2 = gxmessagePresent();
      if (((iVar2 != 0) || (iVar2 = gmessagePresent(), iVar2 != 0)) ||
         ((iVar2 = gdialogPresent(), iVar2 == 0 &&
          ((iVar2 = xdialogPresent(), iVar2 == 0 && (iVar2 = xmessagePresent(), iVar2 != 0)))))) {
        iVar2 = gxmessagePresent();
        if (iVar2 == 0) {
          iVar2 = gmessagePresent();
          if (iVar2 == 0) {
            if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
              uVar5 = 0x6567617373656d78;
              goto LAB_00111ec6;
            }
            uVar5 = 0x6567617373656d78;
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
              uVar5 = 0x6567617373656d67;
LAB_00111ec6:
              tinyfd_response._0_4_ = (undefined4)uVar5;
              tinyfd_response._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
              tinyfd_response[6] = (char)((ulong)uVar5 >> 0x30);
              tinyfd_response[7] = (char)((ulong)uVar5 >> 0x38);
              tinyfd_response[8] = '\0';
              return 1;
            }
            uVar5 = 0x6567617373656d67;
          }
          *(undefined8 *)__dest = uVar5;
          __dest[8] = '\0';
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
            builtin_strncpy(tinyfd_response,"gxmessage",10);
            return 1;
          }
          builtin_strncpy(__dest,"gxmessage",10);
        }
        if (aDialogType == (char *)0x0) {
LAB_00111b1a:
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3," -buttons Ok:1",0xf);
LAB_00111b3f:
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3," -defaul",8);
          uVar5 = 0x6b4f20746c7561;
LAB_00111b5f:
          *(undefined8 *)(__dest + sVar3 + 5) = uVar5;
        }
        else {
          iVar2 = strcmp("okcancel",aDialogType);
          if (iVar2 != 0) {
            iVar2 = strcmp("yesno",aDialogType);
            if (iVar2 == 0) {
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3," -buttons Yes:1,No:0",0x15);
              if (aDefaultButton != 0) {
LAB_00111c72:
                if (aDefaultButton == 1) {
                  sVar3 = strlen(__dest);
                  builtin_strncpy(__dest + sVar3," -default Yes",0xe);
                }
                goto LAB_00111b64;
              }
            }
            else {
              iVar2 = strcmp("yesnocancel",aDialogType);
              if (iVar2 != 0) goto LAB_00111b1a;
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3," -buttons Yes:1,No:2,Cancel:0",0x1e);
              if (aDefaultButton == 0) goto LAB_00111cf6;
              if (aDefaultButton != 2) goto LAB_00111c72;
            }
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3," -defaul",8);
            uVar5 = 0x6f4e20746c7561;
            goto LAB_00111b5f;
          }
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3," -buttons Ok:1,Cancel:0",0x18);
          if (aDefaultButton == 0) {
LAB_00111cf6:
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3," -default Cancel",0x11);
          }
          else if (aDefaultButton == 1) goto LAB_00111b3f;
        }
LAB_00111b64:
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3," -center \"",0xb);
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          strcat(__dest,aMessage);
        }
        sVar3 = strlen(__dest);
        (__dest + sVar3)[0] = '\"';
        (__dest + sVar3)[1] = '\0';
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3," -title  \"",0xb);
          strcat(__dest,aTitle);
          sVar3 = strlen(__dest);
          (__dest + sVar3)[0] = '\"';
          (__dest + sVar3)[1] = '\0';
        }
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3," ; echo $? ",0xc);
        goto LAB_001117c9;
      }
      iVar2 = xdialogPresent();
      if ((((iVar2 != 0) || (iVar2 = gdialogPresent(), iVar2 != 0)) ||
          (pcVar4 = dialogName(), pcVar4 != (char *)0x0)) || (iVar2 = whiptailPresent(), iVar2 != 0)
         ) {
        iVar2 = gdialogPresent();
        if (iVar2 == 0) {
          iVar2 = xdialogPresent();
          if (iVar2 != 0) {
            if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
              uVar5 = 0x676f6c61696478;
              goto LAB_00111124;
            }
            uVar5 = 0x676f6c6169645828;
            goto LAB_00111d55;
          }
          pcVar4 = dialogName();
          if (pcVar4 == (char *)0x0) {
            iVar2 = isTerminalRunning();
            if (iVar2 == 0) {
              if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                builtin_strncpy(tinyfd_response,"whiptail",9);
                return 0;
              }
              pcVar4 = terminalName();
              strcpy(__dest,pcVar4);
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3,"\'(whiptail ",0xc);
              goto LAB_00112690;
            }
            if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
              builtin_strncpy(tinyfd_response,"whiptail",9);
              return 0;
            }
            builtin_strncpy(__dest,"(whiptail ",0xb);
LAB_001123ff:
            bVar1 = true;
            bVar8 = true;
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
              builtin_strncpy(tinyfd_response,"dialog",7);
              return 0;
            }
            iVar2 = isTerminalRunning();
            if (iVar2 != 0) {
              builtin_strncpy(__dest,"(dialog ",9);
              goto LAB_001123ff;
            }
            pcVar4 = terminalName();
            strcpy(__dest,pcVar4);
            sVar3 = strlen(__dest);
            (__dest + sVar3)[0] = '\'';
            (__dest + sVar3)[1] = '(';
            __dest[sVar3 + 2] = '\0';
            pcVar4 = dialogName();
            strcat(__dest,pcVar4);
            sVar3 = strlen(__dest);
            (__dest + sVar3)[0] = ' ';
            (__dest + sVar3)[1] = '\0';
LAB_00112690:
            bVar8 = true;
            bVar1 = false;
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
            uVar5 = 0x676f6c61696467;
            goto LAB_00111124;
          }
          uVar5 = 0x676f6c6169646728;
LAB_00111d55:
          *(undefined8 *)__dest = uVar5;
          __dest[8] = ' ';
          __dest[9] = '\0';
          bVar1 = true;
          bVar8 = false;
        }
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"--title \"",10);
          strcat(__dest,aTitle);
          sVar3 = strlen(__dest);
          (__dest + sVar3)[0] = '\"';
          (__dest + sVar3)[1] = ' ';
          __dest[sVar3 + 2] = '\0';
        }
        iVar2 = xdialogPresent();
        if (((iVar2 == 0) && (iVar2 = gdialogPresent(), aDialogType != (char *)0x0 && iVar2 == 0))
           && ((iVar2 = strcmp("okcancel",aDialogType), iVar2 == 0 ||
               ((iVar2 = strcmp("yesno",aDialogType), iVar2 == 0 ||
                (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 == 0)))))) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"--backtitle \"",0xe);
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"tab: move focus",0x10);
          sVar3 = strlen(__dest);
          (__dest + sVar3)[0] = '\"';
          (__dest + sVar3)[1] = ' ';
          __dest[sVar3 + 2] = '\0';
        }
        if (aDialogType == (char *)0x0) {
LAB_00111e9a:
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"--msgbox ",10);
        }
        else {
          iVar2 = strcmp("okcancel",aDialogType);
          if (iVar2 == 0) {
            if (aDefaultButton == 0) {
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3,"--defaultno ",0xd);
            }
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"--yes-label \"Ok\" --no-label \"Cancel\" --yesno ",0x2e)
            ;
          }
          else {
            iVar2 = strcmp("yesno",aDialogType);
            if (iVar2 == 0) {
              if (aDefaultButton == 0) {
                sVar3 = strlen(__dest);
                builtin_strncpy(__dest + sVar3,"--defaultno ",0xd);
              }
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3,"--yesno ",9);
            }
            else {
              iVar2 = strcmp("yesnocancel",aDialogType);
              if (iVar2 != 0) goto LAB_00111e9a;
              if (aDefaultButton == 0) {
                sVar3 = strlen(__dest);
                builtin_strncpy(__dest + sVar3,"--defaultno ",0xd);
              }
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3,"--menu ",8);
            }
          }
        }
        sVar3 = strlen(__dest);
        (__dest + sVar3)[0] = '\"';
        (__dest + sVar3)[1] = '\0';
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          strcat(__dest,aMessage);
        }
        sVar3 = strlen(__dest);
        (__dest + sVar3)[0] = '\"';
        (__dest + sVar3)[1] = ' ';
        __dest[sVar3 + 2] = '\0';
        if (bVar8) {
          if ((aDialogType == (char *)0x0) ||
             (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0)) {
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"10 60 >/dev/tty) 2>&1;if [ $? = 0 ];",0x25);
            sVar3 = strlen(__dest);
            pcVar4 = __dest + sVar3;
            if (!bVar1) {
              __src = 
              "then\n\techo 1\nelse\n\techo 0\nfi >/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt"
              ;
              sVar3 = 0x56;
              goto LAB_001117c4;
            }
            builtin_strncpy(__dest + sVar3 + 0x10," echo 0;fi;clear >/dev/tty",0x1b);
            uVar10._0_1_ = 't';
            uVar10._1_1_ = 'h';
            uVar10._2_1_ = 'e';
            uVar10._3_1_ = 'n';
            uVar14._0_1_ = ' ';
            uVar14._1_1_ = 'e';
            uVar14._2_1_ = 'c';
            uVar14._3_1_ = 'h';
            uVar19._0_1_ = 'o';
            uVar19._1_1_ = ' ';
            uVar19._2_1_ = '1';
            uVar19._3_1_ = ';';
            uVar23._0_1_ = 'e';
            uVar23._1_1_ = 'l';
            uVar23._2_1_ = 's';
            uVar23._3_1_ = 'e';
          }
          else {
            sVar3 = strlen(__dest);
            memcpy(__dest + sVar3,
                   "0 60 0 Yes \"\" No \"\" >/dev/tty ) 2>/tmp/tinyfd.txt;                if [ $? = 0 ];then tinyfdBool=1;else tinyfdBool=0;fi;                tinyfdRes=$(cat /tmp/tinyfd.txt);echo $tinyfdBool$tinyfdRes"
                   ,0xc3);
            sVar3 = strlen(__dest);
            pcVar4 = __dest + sVar3;
            if (bVar1) {
              builtin_strncpy(__dest + sVar3,"; clear >/dev/tty",0x12);
              goto LAB_001117c9;
            }
            builtin_strncpy(__dest + sVar3 + 0x10,"xt\';cat /tmp/tinyfd0.txt",0x19);
            uVar10._0_1_ = ' ';
            uVar10._1_1_ = '>';
            uVar10._2_1_ = '/';
            uVar10._3_1_ = 't';
            uVar14._0_1_ = 'm';
            uVar14._1_1_ = 'p';
            uVar14._2_1_ = '/';
            uVar14._3_1_ = 't';
            uVar19._0_1_ = 'i';
            uVar19._1_1_ = 'n';
            uVar19._2_1_ = 'y';
            uVar19._3_1_ = 'f';
            uVar23._0_1_ = 'd';
            uVar23._1_1_ = '0';
            uVar23._2_1_ = '.';
            uVar23._3_1_ = 't';
          }
          goto LAB_001117b0;
        }
        if ((aDialogType == (char *)0x0) || (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 != 0))
        {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3 + 0x2e,"ho 0;fi",8);
          builtin_strncpy(__dest + sVar3,"10 60 ) 2>&1;if [ $? = 0 ];then ",0x20);
          uVar11._0_1_ = 'e';
          uVar11._1_1_ = 'c';
          uVar11._2_1_ = 'h';
          uVar11._3_1_ = 'o';
          uVar15._0_1_ = ' ';
          uVar15._1_1_ = '1';
          uVar15._2_1_ = ';';
          uVar15._3_1_ = 'e';
          uVar20._0_1_ = 'l';
          uVar20._1_1_ = 's';
          uVar20._2_1_ = 'e';
          uVar20._3_1_ = ' ';
          uVar24._0_1_ = 'e';
          uVar24._1_1_ = 'c';
          uVar24._2_1_ = 'h';
          uVar24._3_1_ = 'o';
          goto LAB_00112331;
        }
        sVar3 = strlen(__dest);
        pcVar4 = __dest + sVar3;
        __src = 
        "0 60 0 Yes \"\" No \"\") 2>/tmp/tinyfd.txt;if [ $? = 0 ];then tinyfdBool=1;else tinyfdBool=0;fi;tinyfdRes=$(cat /tmp/tinyfd.txt);echo $tinyfdBool$tinyfdRes"
        ;
        sVar3 = 0x98;
        goto LAB_001117c4;
      }
      iVar2 = isTerminalRunning();
      if ((iVar2 == 0) && (pcVar4 = terminalName(), pcVar4 != (char *)0x0)) {
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          builtin_strncpy(tinyfd_response,"basicinput",0xb);
          return 0;
        }
        pcVar4 = terminalName();
        strcpy(__dest,pcVar4);
        sVar3 = strlen(__dest);
        (__dest + sVar3)[0] = '\'';
        (__dest + sVar3)[1] = '\0';
        if (tinyfd_forceConsole == 0 && gWarningDisplayed == 0) {
          gWarningDisplayed = 1;
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"echo \"",7);
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"missing software! (we will try basic console input)",0x34)
          ;
          sVar3 = strlen(__dest);
          (__dest + sVar3)[0] = '\"';
          (__dest + sVar3)[1] = ';';
          __dest[sVar3 + 2] = '\0';
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"echo \"",7);
          sVar3 = strlen(__dest);
          memcpy(__dest + sVar3,
                 " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                 ,0x15f);
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"\";echo;echo;",0xd);
        }
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"echo \"",7);
          strcat(__dest,aTitle);
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"\";echo;",8);
        }
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"echo \"",7);
          strcat(__dest,aMessage);
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"\"; ",4);
        }
        if (aDialogType == (char *)0x0) {
LAB_001129d8:
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"echo -n \"press enter to continue \"; ",0x25);
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"stty sane -echo;",0x11);
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"answer=$( while ! head -c 1;do true ;done);echo 1",0x32);
        }
        else {
          iVar2 = strcmp("yesno",aDialogType);
          if (iVar2 == 0) {
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"echo -n \"y/n: \"; ",0x12);
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"stty sane -echo;",0x11);
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,
                            "answer=$( while ! head -c 1 | grep -i [ny];do true ;done);",0x3b);
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3 + 0x20,"\";then\n",8);
            builtin_strncpy(__dest + sVar3,"if echo \"$answer",0x10);
            uVar25._0_1_ = ' ';
            uVar25._1_1_ = '\"';
            uVar25._2_1_ = '^';
            uVar25._3_1_ = 'y';
LAB_0011351b:
            pcVar4 = __dest + sVar3 + 0x10;
            pcVar4[0] = '\"';
            pcVar4[1] = ' ';
            pcVar4[2] = '|';
            pcVar4[3] = ' ';
            pcVar4[4] = 'g';
            pcVar4[5] = 'r';
            pcVar4[6] = 'e';
            pcVar4[7] = 'p';
            pcVar4[8] = ' ';
            pcVar4[9] = '-';
            pcVar4[10] = 'i';
            pcVar4[0xb] = 'q';
            *(undefined4 *)(pcVar4 + 0xc) = uVar25;
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3 + 0x10,"ho 0\nfi",8);
            uVar12._0_1_ = '\t';
            uVar12._1_1_ = 'e';
            uVar12._2_1_ = 'c';
            uVar12._3_1_ = 'h';
            uVar17._0_1_ = 'o';
            uVar17._1_1_ = ' ';
            uVar17._2_1_ = '1';
            uVar17._3_1_ = '\n';
            uVar21._0_1_ = 'e';
            uVar21._1_1_ = 'l';
            uVar21._2_1_ = 's';
            uVar21._3_1_ = 'e';
            uVar26._0_1_ = '\n';
            uVar26._1_1_ = '\t';
            uVar26._2_1_ = 'e';
            uVar26._3_1_ = 'c';
          }
          else {
            iVar2 = strcmp("okcancel",aDialogType);
            if (iVar2 == 0) {
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3,"echo -n \"[O]kay/[C]ancel: \"; ",0x1e);
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3,"stty sane -echo;",0x11);
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3,
                              "answer=$( while ! head -c 1 | grep -i [oc];do true ;done);",0x3b);
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3 + 0x20,"\";then\n",8);
              builtin_strncpy(__dest + sVar3,"if echo \"$answer",0x10);
              uVar25._0_1_ = ' ';
              uVar25._1_1_ = '\"';
              uVar25._2_1_ = '^';
              uVar25._3_1_ = 'o';
              goto LAB_0011351b;
            }
            iVar2 = strcmp("yesnocancel",aDialogType);
            if (iVar2 != 0) goto LAB_001129d8;
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"echo -n \"[Y]es/[N]o/[C]ancel: \"; ",0x22);
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"stty sane -echo;",0x11);
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,
                            "answer=$( while ! head -c 1 | grep -i [nyc];do true ;done);",0x3c);
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"if echo \"$answer\" | grep -iq \"^y\";then\n\techo 1\n",
                            0x30);
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,
                            "elif echo \"$answer\" | grep -iq \"^n\";then\n\techo 2\n",0x32);
            sVar3 = strlen(__dest);
            uVar12._0_1_ = 'e';
            uVar12._1_1_ = 'l';
            uVar12._2_1_ = 's';
            uVar12._3_1_ = 'e';
            uVar17._0_1_ = '\n';
            uVar17._1_1_ = '\t';
            uVar17._2_1_ = 'e';
            uVar17._3_1_ = 'c';
            uVar21._0_1_ = 'h';
            uVar21._1_1_ = 'o';
            uVar21._2_1_ = ' ';
            uVar21._3_1_ = '0';
            uVar26._0_1_ = '\n';
            uVar26._1_1_ = 'f';
            uVar26._2_1_ = 'i';
            uVar26._3_1_ = '\0';
          }
          pcVar4 = __dest + sVar3;
          *(undefined4 *)pcVar4 = uVar12;
          *(undefined4 *)(pcVar4 + 4) = uVar17;
          *(undefined4 *)(pcVar4 + 8) = uVar21;
          *(undefined4 *)(pcVar4 + 0xc) = uVar26;
        }
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3," >/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt",
                        0x3a);
        goto LAB_001117c9;
      }
      iVar2 = isTerminalRunning();
      if (((iVar2 != 0) || (iVar2 = pythonDbusPresent(), iVar2 == 0)) ||
         (iVar2 = strcmp("ok",aDialogType), iVar2 != 0)) {
        iVar2 = isTerminalRunning();
        if (((iVar2 == 0) && (iVar2 = perlPresent(), 1 < iVar2)) &&
           (iVar2 = strcmp("ok",aDialogType), iVar2 == 0)) {
          pcVar4 = "";
          if ((aTitle != (char *)0x0) &&
             (iVar2 = strcmp(aTitle,"tinyfd_query"), pcVar4 = aTitle, iVar2 == 0)) {
            builtin_strncpy(tinyfd_response,"perl-dbus",10);
            return 1;
          }
          if (aIconType == (char *)0x0) {
            aIconType = "";
          }
          if (aMessage == (char *)0x0) {
            aMessage = "";
          }
          sprintf(__dest,
                  "perl -e \"use Net::DBus;                                                                 my \\$sessionBus = Net::DBus->session;                                                                 my \\$notificationsService = \\$sessionBus->get_service(\'org.freedesktop.Notifications\');                                                                 my \\$notificationsObject = \\$notificationsService->get_object(\'/org/freedesktop/Notifications\',                                                                 \'org.freedesktop.Notifications\');                                                                 my \\$notificationId;\\$notificationId = \\$notificationsObject->Notify(shift, 0, \'%s\', \'%s\', \'%s\', [], {}, -1);\" "
                  ,aIconType,pcVar4,aMessage);
        }
        else {
          iVar2 = isTerminalRunning();
          if (((iVar2 != 0) || (iVar2 = notifysendPresent(), iVar2 == 0)) ||
             (iVar2 = strcmp("ok",aDialogType), iVar2 != 0)) {
            if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
              builtin_strncpy(tinyfd_response,"basicinput",0xb);
              return 0;
            }
            if (tinyfd_forceConsole == 0 && gWarningDisplayed == 0) {
              gWarningDisplayed = 1;
              printf("\n\n%s\n","missing software! (we will try basic console input)");
              printf("%s\n\n",
                     " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                    );
            }
            if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
              printf("\n%s\n",aTitle);
            }
            tcgetattr(0,&local_4b0);
            tcgetattr(0,&local_474);
            local_474.c_lflag._0_1_ = (byte)local_474.c_lflag & 0xfd;
            local_474.c_cc[5] = '\0';
            local_474.c_cc[6] = '\x01';
            tcsetattr(0,0,&local_474);
            if (aDialogType == (char *)0x0) {
LAB_001125f2:
              if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
                printf("\n%s\n\n");
              }
              printf("press enter to continue ");
              fflush(_stdout);
              getchar();
              puts("\n");
LAB_0011263c:
              uVar7 = 1;
            }
            else {
              iVar2 = strcmp("yesno",aDialogType);
              if (iVar2 == 0) {
                do {
                  if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
                    printf("\n%s\n");
                  }
                  printf("y/n: ");
                  fflush(_stdout);
                  iVar2 = getchar();
                  iVar2 = tolower(iVar2);
                  puts("\n");
                  iVar2 = iVar2 << 0x18;
                } while ((iVar2 != 0x79000000) && (iVar2 != 0x6e000000));
                bVar8 = iVar2 == 0x79000000;
              }
              else {
                iVar2 = strcmp("okcancel",aDialogType);
                if (iVar2 != 0) {
                  iVar2 = strcmp("yesnocancel",aDialogType);
                  if (iVar2 != 0) goto LAB_001125f2;
                  do {
                    if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
                      printf("\n%s\n");
                    }
                    printf("[Y]es/[N]o/[C]ancel: ");
                    fflush(_stdout);
                    iVar2 = getchar();
                    iVar2 = tolower(iVar2);
                    puts("\n");
                    iVar2 = iVar2 << 0x18;
                    if (iVar2 == 0x63000000) break;
                    if (iVar2 == 0x79000000) goto LAB_0011263c;
                  } while (iVar2 != 0x6e000000);
                  uVar7 = (uint)(iVar2 == 0x6e000000) * 2;
                  goto LAB_001132f5;
                }
                do {
                  if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
                    printf("\n%s\n");
                  }
                  printf("[O]kay/[C]ancel: ");
                  fflush(_stdout);
                  iVar2 = getchar();
                  iVar2 = tolower(iVar2);
                  puts("\n");
                  iVar2 = iVar2 << 0x18;
                } while ((iVar2 != 0x6f000000) && (iVar2 != 0x63000000));
                bVar8 = iVar2 == 0x6f000000;
              }
              uVar7 = (uint)bVar8;
            }
LAB_001132f5:
            tcsetattr(0,0,&local_4b0);
            goto LAB_001118c3;
          }
          if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
            builtin_strncpy(tinyfd_response,"notifysend",0xb);
            return 1;
          }
          builtin_strncpy(__dest,"notify-send",0xc);
          if ((aIconType != (char *)0x0) && (*aIconType != '\0')) {
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3," -i \'",6);
            strcat(__dest,aIconType);
            sVar3 = strlen(__dest);
            (__dest + sVar3)[0] = '\'';
            (__dest + sVar3)[1] = '\0';
          }
          sVar3 = strlen(__dest);
          (__dest + sVar3)[0] = ' ';
          (__dest + sVar3)[1] = '\"';
          __dest[sVar3 + 2] = '\0';
          if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
            strcat(__dest,aTitle);
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3," | ",4);
          }
          if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
            replaceSubStr(aMessage,"\n\t"," |  ",local_438);
            replaceSubStr(aMessage,"\n"," | ",local_438);
            replaceSubStr(aMessage,"\t","  ",local_438);
            strcat(__dest,local_438);
          }
          sVar3 = strlen(__dest);
          (__dest + sVar3)[0] = '\"';
          (__dest + sVar3)[1] = '\0';
        }
        goto LAB_001117c9;
      }
      if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
        builtin_strncpy(tinyfd_response,"python-dbus",0xc);
        return 1;
      }
      strcpy(__dest,gPythonName);
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3," -c \"import dbus;bus=dbus.SessionBus();",0x28);
      sVar3 = strlen(__dest);
      memcpy(__dest + sVar3,
             "notif=bus.get_object(\'org.freedesktop.Notifications\',\'/org/freedesktop/Notifications\');"
             ,0x58);
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3,
                      "notify=dbus.Interface(notif,\'org.freedesktop.Notifications\');",0x3e);
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3,"notify.Notify(\'\',0,\'",0x15);
      if ((aIconType != (char *)0x0) && (*aIconType != '\0')) {
        strcat(__dest,aIconType);
      }
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3,"\',\'",4);
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        strcat(__dest,aTitle);
      }
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3,"\',\'",4);
      if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
        sVar3 = strlen(__dest);
        replaceSubStr(aMessage,"\n","\\n",__dest + sVar3);
      }
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3,"\',\'\',\'\',",8);
      uVar5 = 0x2229303030352c;
      goto LAB_00110ff6;
    }
LAB_00110e35:
    iVar2 = zenityPresent();
    if (iVar2 == 0) {
      iVar2 = matedialogPresent();
      if (iVar2 == 0) {
        if (shellementaryPresent_lShellementaryPresent == '\0') {
          shellementaryPresent_lShellementaryPresent = '\x01';
        }
        if ((shellementaryPresent_lShellementaryPresent == '\0') &&
           (iVar2 = graphicMode(), iVar2 != 0)) {
          if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
            builtin_strncpy(tinyfd_response + 8,"ntary",6);
            uVar5 = 0x656d656c6c656873;
LAB_00111124:
            tinyfd_response._0_4_ = (undefined4)uVar5;
            tinyfd_response._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
            tinyfd_response[6] = (char)((ulong)uVar5 >> 0x30);
            tinyfd_response[7] = (char)((ulong)uVar5 >> 0x38);
            return 1;
          }
          builtin_strncpy(__dest,"szAnswer=$(shellementary",0x19);
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
            builtin_strncpy(tinyfd_response,"qarma",6);
            return 1;
          }
          builtin_strncpy(__dest,"szAnswer=$(qarma",0x11);
          pcVar4 = getenv("SSH_TTY");
          if (pcVar4 == (char *)0x0) {
            sVar3 = strlen(__dest);
            pcVar4 = " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
            __n = 0x41;
            goto LAB_0011142e;
          }
        }
      }
      else {
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          builtin_strncpy(tinyfd_response,"matedialog",0xb);
          return 1;
        }
        builtin_strncpy(__dest,"szAnswer=$(matedialog",0x16);
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
        builtin_strncpy(tinyfd_response,"zenity",7);
        return 1;
      }
      builtin_strncpy(__dest,"szAnswer=$(zenity",0x12);
      iVar2 = zenity3Present();
      if ((3 < iVar2) && (pcVar4 = getenv("SSH_TTY"), pcVar4 == (char *)0x0)) {
        sVar3 = strlen(__dest);
        pcVar4 = " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
        __n = 0x4b;
LAB_0011142e:
        memcpy(__dest + sVar3,pcVar4,__n);
      }
    }
    sVar3 = strlen(__dest);
    builtin_strncpy(__dest + sVar3," --",4);
    if (aDialogType == (char *)0x0) {
LAB_00111488:
      if (aIconType == (char *)0x0) {
LAB_001114bb:
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"info",5);
      }
      else {
        iVar2 = strcmp("error",aIconType);
        if (iVar2 == 0) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"error",6);
        }
        else {
          iVar2 = strcmp("warning",aIconType);
          if (iVar2 != 0) goto LAB_001114bb;
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"warning",8);
        }
      }
    }
    else {
      iVar2 = strcmp("okcancel",aDialogType);
      if (iVar2 == 0) {
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"question --ok-label=Ok --cancel-label=Cancel",0x2d);
      }
      else {
        iVar2 = strcmp("yesno",aDialogType);
        if (iVar2 == 0) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"question",9);
        }
        else {
          iVar2 = strcmp("yesnocancel",aDialogType);
          if (iVar2 != 0) goto LAB_00111488;
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"list --column \"\" --hide-header \"Yes\" \"No\"",0x2a);
        }
      }
    }
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3," --title=\"",0xb);
      strcat(__dest,aTitle);
      sVar3 = strlen(__dest);
      (__dest + sVar3)[0] = '\"';
      (__dest + sVar3)[1] = '\0';
    }
    if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3," --no-wrap --text=\"",0x14);
      strcat(__dest,aMessage);
      sVar3 = strlen(__dest);
      (__dest + sVar3)[0] = '\"';
      (__dest + sVar3)[1] = '\0';
    }
    iVar2 = zenity3Present();
    if (iVar2 < 3) {
      iVar2 = zenityPresent();
      if (iVar2 == 0) {
        if (shellementaryPresent_lShellementaryPresent == '\0') {
          shellementaryPresent_lShellementaryPresent = '\x01';
        }
        if (((shellementaryPresent_lShellementaryPresent == '\0') &&
            (iVar2 = graphicMode(), iVar2 != 0)) || (iVar2 = qarmaPresent(), iVar2 != 0))
        goto LAB_00111678;
      }
    }
    else {
LAB_00111678:
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3," --icon-name=dialog-",0x15);
      if ((aIconType == (char *)0x0) ||
         (((iVar2 = strcmp("question",aIconType), iVar2 != 0 &&
           (iVar2 = strcmp("error",aIconType), iVar2 != 0)) &&
          (iVar2 = strcmp("warning",aIconType), iVar2 != 0)))) {
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"information",0xc);
      }
      else {
        strcat(__dest,aIconType);
      }
    }
    if (tinyfd_silent != 0) {
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3," 2>/dev/null ",0xe);
    }
    iVar2 = strcmp("yesnocancel",aDialogType);
    sVar3 = strlen(__dest);
    pcVar4 = __dest + sVar3;
    if (iVar2 == 0) {
      __src = ");if [ $? = 1 ];then echo 0;elif [ $szAnswer = \"No\" ];then echo 2;else echo 1;fi";
      sVar3 = 0x51;
LAB_001117c4:
      memcpy(pcVar4,__src,sVar3);
    }
    else {
      builtin_strncpy(__dest + sVar3 + 0x10,"then echo 1;else echo 0;fi",0x1b);
      uVar10._0_1_ = ')';
      uVar10._1_1_ = ';';
      uVar10._2_1_ = 'i';
      uVar10._3_1_ = 'f';
      uVar14._0_1_ = ' ';
      uVar14._1_1_ = '[';
      uVar14._2_1_ = ' ';
      uVar14._3_1_ = '$';
      uVar19._0_1_ = '?';
      uVar19._1_1_ = ' ';
      uVar19._2_1_ = '=';
      uVar19._3_1_ = ' ';
      uVar23._0_1_ = '0';
      uVar23._1_1_ = ' ';
      uVar23._2_1_ = ']';
      uVar23._3_1_ = ';';
LAB_001117b0:
      *(undefined4 *)pcVar4 = uVar10;
      *(undefined4 *)(pcVar4 + 4) = uVar14;
      *(undefined4 *)(pcVar4 + 8) = uVar19;
      *(undefined4 *)(pcVar4 + 0xc) = uVar23;
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
      builtin_strncpy(tinyfd_response,"applescript",0xc);
      return 1;
    }
    builtin_strncpy(__dest,"osascript ",0xb);
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3," -e \'tell application \"System Events\"\' -e \'Activate\'",
                      0x35);
    }
    sVar3 = strlen(__dest);
    memcpy(__dest + sVar3,
           " -e \'try\' -e \'set {vButton} to {button returned} of ( display dialog \"",0x47);
    if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
      strcat(__dest,aMessage);
    }
    sVar3 = strlen(__dest);
    (__dest + sVar3)[0] = '\"';
    (__dest + sVar3)[1] = ' ';
    __dest[sVar3 + 2] = '\0';
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3,"with title \"",0xd);
      strcat(__dest,aTitle);
      sVar3 = strlen(__dest);
      (__dest + sVar3)[0] = '\"';
      (__dest + sVar3)[1] = ' ';
      __dest[sVar3 + 2] = '\0';
    }
    sVar3 = strlen(__dest);
    builtin_strncpy(__dest + sVar3,"with icon ",0xb);
    if (aIconType == (char *)0x0) {
LAB_00110cbb:
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3,"note",4);
LAB_00110ebd:
      (__dest + sVar3 + 4)[0] = ' ';
      (__dest + sVar3 + 4)[1] = '\0';
    }
    else {
      iVar2 = strcmp("error",aIconType);
      if (iVar2 == 0) {
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"stop",4);
        goto LAB_00110ebd;
      }
      iVar2 = strcmp("warning",aIconType);
      if (iVar2 != 0) goto LAB_00110cbb;
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3,"caution ",9);
    }
    if (aDialogType == (char *)0x0) {
LAB_00110f0e:
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3,"buttons {\"OK\"} ",0x10);
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3 + 0xd,"n \"OK\" ",8);
      uVar9._0_1_ = 'd';
      uVar9._1_1_ = 'e';
      uVar9._2_1_ = 'f';
      uVar9._3_1_ = 'a';
      uVar13._0_1_ = 'u';
      uVar13._1_1_ = 'l';
      uVar13._2_1_ = 't';
      uVar13._3_1_ = ' ';
      uVar18._0_1_ = 'b';
      uVar18._1_1_ = 'u';
      uVar18._2_1_ = 't';
      uVar18._3_1_ = 't';
      uVar22._0_1_ = 'o';
      uVar22._1_1_ = 'n';
      uVar22._2_1_ = ' ';
      uVar22._3_1_ = '\"';
LAB_00110f3f:
      pcVar4 = __dest + sVar3;
      *(undefined4 *)pcVar4 = uVar9;
      *(undefined4 *)(pcVar4 + 4) = uVar13;
      *(undefined4 *)(pcVar4 + 8) = uVar18;
      *(undefined4 *)(pcVar4 + 0xc) = uVar22;
    }
    else {
      iVar2 = strcmp("okcancel",aDialogType);
      if (iVar2 == 0) {
        if (aDefaultButton == 0) {
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"default button \"Cancel\" ",0x19);
        }
      }
      else {
        iVar2 = strcmp("yesno",aDialogType);
        if (iVar2 != 0) {
          iVar2 = strcmp("yesnocancel",aDialogType);
          if (iVar2 != 0) goto LAB_00110f0e;
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3,"buttons {\"No\", \"Yes\", \"Cancel\"} ",0x21);
          if (aDefaultButton == 0) {
            sVar3 = strlen(__dest);
            builtin_strncpy(__dest + sVar3,"default button \"Cancel\" ",0x19);
          }
          else {
            if (aDefaultButton == 2) {
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3 + 0xd,"n \"No\" ",8);
            }
            else {
              if (aDefaultButton != 1) goto LAB_00111582;
              sVar3 = strlen(__dest);
              builtin_strncpy(__dest + sVar3 + 0xe," \"Yes\" ",8);
            }
            builtin_strncpy(__dest + sVar3,"default button \"",0x10);
          }
LAB_00111582:
          sVar3 = strlen(__dest);
          builtin_strncpy(__dest + sVar3 + 0xf,"Cancel\"",8);
          uVar9._0_1_ = 'c';
          uVar9._1_1_ = 'a';
          uVar9._2_1_ = 'n';
          uVar9._3_1_ = 'c';
          uVar13._0_1_ = 'e';
          uVar13._1_1_ = 'l';
          uVar13._2_1_ = ' ';
          uVar13._3_1_ = 'b';
          uVar18._0_1_ = 'u';
          uVar18._1_1_ = 't';
          uVar18._2_1_ = 't';
          uVar18._3_1_ = 'o';
          uVar22._0_1_ = 'n';
          uVar22._1_1_ = ' ';
          uVar22._2_1_ = '\"';
          uVar22._3_1_ = 'C';
          goto LAB_00110f3f;
        }
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"buttons {\"No\", \"Yes\"} ",0x17);
        sVar3 = strlen(__dest);
        if (aDefaultButton == 0) {
          builtin_strncpy(__dest + sVar3,"default button \"No\" ",0x15);
        }
        else {
          builtin_strncpy(__dest + sVar3,"default button \"Yes\" ",0x16);
        }
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"cancel button \"No\"",0x13);
      }
    }
    sVar3 = strlen(__dest);
    builtin_strncpy(__dest + sVar3,")\' ",4);
    sVar3 = strlen(__dest);
    memcpy(__dest + sVar3,
           "-e \'if vButton is \"Yes\" then\' -e \'return 1\' -e \'else if vButton is \"OK\" then\' -e \'return 1\' -e \'else if vButton is \"No\" then\' -e \'return 2\' -e \'else\' -e \'return 0\' -e \'end if\' "
           ,0xb1);
    sVar3 = strlen(__dest);
    builtin_strncpy(__dest + sVar3,"-e \'on error number -128\' ",0x1b);
    sVar3 = strlen(__dest);
    builtin_strncpy(__dest + sVar3,"-e \'0\' ",8);
    sVar3 = strlen(__dest);
    builtin_strncpy(__dest + sVar3,"-e \'end try\'",0xd);
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      sVar3 = strlen(__dest);
      builtin_strncpy(__dest + sVar3," -e \'end",8);
      uVar5 = 0x276c6c65742064;
LAB_00110ff6:
      *(undefined8 *)(__dest + sVar3 + 7) = uVar5;
    }
  }
LAB_001117c9:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",__dest);
  }
  __stream = popen(__dest,"r");
  if (__stream == (FILE *)0x0) {
    free(__dest);
    return 0;
  }
  do {
    pcVar4 = fgets(local_438,0x400,__stream);
  } while (pcVar4 != (char *)0x0);
  pclose(__stream);
  sVar3 = strlen(local_438);
  if (local_438[sVar3 - 1] == '\n') {
    local_474.c_cc[sVar3 + 0x2a] = '\0';
  }
  if (((aDialogType != (char *)0x0) && (iVar2 = strcmp("yesnocancel",aDialogType), iVar2 == 0)) &&
     (local_438[0] == '1')) {
    if (CONCAT13(uStack_434,CONCAT12(local_438[3],CONCAT11(local_438[2],local_438[1]))) == 0x736559)
    {
      local_438[0] = '1';
      local_438[1] = 0;
    }
    else if (local_438[3] == '\0' && CONCAT11(local_438[2],local_438[1]) == 0x6f4e) {
      local_438[0] = '2';
      local_438[1] = 0;
    }
  }
  uVar7 = 2;
  if (CONCAT11(local_438[1],local_438[0]) != 0x32) {
    uVar7 = (uint)(CONCAT11(local_438[1],local_438[0]) == 0x31);
  }
LAB_001118c3:
  free(__dest);
  return uVar7;
}

Assistant:

int tinyfd_messageBox(
        char const * const aTitle , /* NULL or "" */
        char const * const aMessage , /* NULL or ""  may contain \n and \t */
        char const * const aDialogType , /* "ok" "okcancel" "yesno" "yesnocancel" */
        char const * const aIconType , /* "info" "warning" "error" "question" */
        int const aDefaultButton ) /* 0 for cancel/no , 1 for ok/yes , 2 for no in yesnocancel */
{
        char lChar ;

#ifndef TINYFD_NOLIB
        if ((!tinyfd_forceConsole || !(GetConsoleWindow() || dialogPresent()))
                && (!getenv("SSH_CLIENT") || getenv("DISPLAY")))
        {
                if (aTitle&&!strcmp(aTitle, "tinyfd_query")){ strcpy(tinyfd_response, "windows"); return 1; }
                if (tinyfd_winUtf8)
                {
                        return messageBoxWinGui8(
                                aTitle, aMessage, aDialogType, aIconType, aDefaultButton);
                }
                else
                {
                        return messageBoxWinGuiA(
                                aTitle, aMessage, aDialogType, aIconType, aDefaultButton);
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return 0;}
                return messageBoxWinConsole(
                                        aTitle,aMessage,aDialogType,aIconType,aDefaultButton);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return 0;}
                if (!gWarningDisplayed && !tinyfd_forceConsole )
                {
                        gWarningDisplayed = 1; 
                        printf("\n\n%s\n", gTitle);
                        printf("%s\n\n", tinyfd_needs);
                }
                if ( aTitle && strlen(aTitle) )
                {
                        printf("\n%s\n\n", aTitle);
                }
                if ( aDialogType && !strcmp("yesno",aDialogType) )
                {
                        do
                        {
                                if ( aMessage && strlen(aMessage) )
                                {
                                        printf("%s\n",aMessage);
                                }
                                printf("y/n: ");
                                lChar = (char) tolower( _getch() ) ;
                                printf("\n\n");
                        }
                        while ( lChar != 'y' && lChar != 'n' ) ;
                        return lChar == 'y' ? 1 : 0 ;
                }
                else if ( aDialogType && !strcmp("okcancel",aDialogType) )
                {
                        do
                        {
                                if ( aMessage && strlen(aMessage) )
                                {
                                        printf("%s\n",aMessage);
                                }
                                printf("[O]kay/[C]ancel: ");
                                lChar = (char) tolower( _getch() ) ;
                                printf("\n\n");
                        }
                        while ( lChar != 'o' && lChar != 'c' ) ;
                        return lChar == 'o' ? 1 : 0 ;
                }
                else if (aDialogType && !strcmp("yesnocancel", aDialogType))
                {
                        do
                        {
                                if (aMessage && strlen(aMessage))
                                {
                                        printf("%s\n", aMessage);
                                }
                                printf("[Y]es/[N]o/[C]ancel: ");
                                lChar = (char)tolower(_getch());
                                printf("\n\n");
                        } while (lChar != 'y' && lChar != 'n' && lChar != 'c');
                        return (lChar == 'y') ? 1 : (lChar == 'n') ? 2 : 0 ;
                }
                else
                {
                        if ( aMessage && strlen(aMessage) )
                        {
                                printf("%s\n\n",aMessage);
                        }
                        printf("press enter to continue ");
                        lChar = (char) _getch() ;
                        printf("\n\n");
                        return 1 ;
                }
        }
}